

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::DockContextNewFrameUpdateUndocking(ImGuiContext *ctx)

{
  ImGuiDockContext *this;
  ImGuiID *pIVar1;
  ImGuiDockNode *src_node;
  ImGuiDockNode *pIVar2;
  ImGuiStoragePair *pIVar3;
  ImGuiDockRequest *pIVar4;
  ImGuiDockNode *pIVar5;
  ImGuiWindow **ppIVar6;
  bool clear_persistent_docking_ref;
  int n;
  int iVar7;
  int i;
  uint flags;
  ImVector<ImGuiDockRequest> *this_00;
  ImVec2 IVar8;
  ImGuiWindow *local_38;
  
  this = &ctx->DockContext;
  if (((ctx->IO).ConfigFlags & 0x40) == 0) {
    if ((0 < (this->Nodes).Data.Size) || (0 < (ctx->DockContext).Requests.Size)) {
      DockContextClearNodes(ctx,0,true);
      return;
    }
  }
  else {
    if ((ctx->IO).ConfigDockingNoSplit == true) {
      for (iVar7 = 0; iVar7 < (this->Nodes).Data.Size; iVar7 = iVar7 + 1) {
        pIVar3 = ImVector<ImGuiStorage::ImGuiStoragePair>::operator[]
                           ((ImVector<ImGuiStorage::ImGuiStoragePair> *)this,iVar7);
        pIVar1 = (ImGuiID *)(pIVar3->field_1).val_p;
        if (((pIVar1 != (ImGuiID *)0x0) && (*(long *)(pIVar1 + 6) == 0)) &&
           (*(long *)(pIVar1 + 8) != 0)) {
          DockBuilderRemoveNodeChildNodes(*pIVar1);
        }
      }
    }
    if ((ctx->DockContext).WantFullRebuild == true) {
      DockContextRebuildNodes(ctx);
      (ctx->DockContext).WantFullRebuild = false;
    }
    this_00 = &(ctx->DockContext).Requests;
    for (iVar7 = 0; iVar7 < this_00->Size; iVar7 = iVar7 + 1) {
      pIVar4 = ImVector<ImGuiDockRequest>::operator[](this_00,iVar7);
      if (pIVar4->Type == ImGuiDockRequestType_Undock) {
        if ((ImGuiContext *)pIVar4->UndockTargetWindow == (ImGuiContext *)0x0) {
          src_node = pIVar4->UndockTargetNode;
          if (src_node != (ImGuiDockNode *)0x0) {
            if (src_node->ChildNodes[0] != (ImGuiDockNode *)0x0) {
              __assert_fail("node->IsLeafNode()",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui.cpp"
                            ,0x37d5,
                            "void ImGui::DockContextProcessUndockNode(ImGuiContext *, ImGuiDockNode *)"
                           );
            }
            if ((src_node->Windows).Size < 1) {
              __assert_fail("node->Windows.Size >= 1",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui.cpp"
                            ,0x37d6,
                            "void ImGui::DockContextProcessUndockNode(ImGuiContext *, ImGuiDockNode *)"
                           );
            }
            pIVar5 = src_node->ParentNode;
            if ((pIVar5 == (ImGuiDockNode *)0x0) || ((src_node->MergedFlags & 0x800) != 0)) {
              pIVar5 = DockContextAddNode(ctx,0);
              pIVar5->Pos = src_node->Pos;
              pIVar5->Size = src_node->Size;
              pIVar5->SizeRef = src_node->SizeRef;
              DockNodeMoveWindows(pIVar5,src_node);
              DockSettingsRenameNodeReferences(src_node->ID,pIVar5->ID);
              for (i = 0; i < (pIVar5->Windows).Size; i = i + 1) {
                ppIVar6 = ImVector<ImGuiWindow_*>::operator[](&pIVar5->Windows,i);
                local_38 = *ppIVar6;
                flags = local_38->Flags & 0xfeffffff;
                local_38->Flags = flags;
                if (local_38->ParentWindow != (ImGuiWindow *)0x0) {
                  ImVector<ImGuiWindow_*>::find_erase
                            (&(local_38->ParentWindow->DC).ChildWindows,&local_38);
                  flags = local_38->Flags;
                }
                UpdateWindowParentAndRootLinks(local_38,flags,(ImGuiWindow *)0x0);
              }
            }
            else {
              pIVar2 = pIVar5->ChildNodes[0];
              if ((pIVar2 != src_node) && (pIVar5->ChildNodes[1] != src_node)) {
                __assert_fail("node->ParentNode->ChildNodes[0] == node || node->ParentNode->ChildNodes[1] == node"
                              ,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/johnor[P]n_e_s_vis/build_O2/_deps/imgui-src/imgui.cpp"
                              ,0x37ee,
                              "void ImGui::DockContextProcessUndockNode(ImGuiContext *, ImGuiDockNode *)"
                             );
              }
              pIVar5->ChildNodes[pIVar2 != src_node] = (ImGuiDockNode *)0x0;
              DockNodeTreeMerge(ctx,src_node->ParentNode,
                                src_node->ParentNode->ChildNodes[pIVar2 == src_node]);
              *(ushort *)&src_node->ParentNode->field_0xc4 =
                   (ushort)*(undefined4 *)&src_node->ParentNode->field_0xc4 & 0xfe3f | 0x80;
              src_node->ParentNode = (ImGuiDockNode *)0x0;
              pIVar5 = src_node;
            }
            *(ushort *)&pIVar5->field_0xc4 = (ushort)*(undefined4 *)&pIVar5->field_0xc4 & 0xffc0 | 9
            ;
            ppIVar6 = ImVector<ImGuiWindow_*>::operator[](&pIVar5->Windows,0);
            IVar8 = FixLargeWindowsWhenUndocking
                              (&pIVar5->Size,&(*ppIVar6)->Viewport->super_ImGuiViewport);
            pIVar5->Size = IVar8;
            pIVar5->field_0xc6 = pIVar5->field_0xc6 | 2;
            if (GImGui->SettingsDirtyTimer <= 0.0) {
              GImGui->SettingsDirtyTimer = (GImGui->IO).IniSavingRate;
            }
          }
        }
        else {
          DockContextProcessUndockWindow
                    ((ImGuiContext *)pIVar4->UndockTargetWindow,(ImGuiWindow *)0x1,
                     clear_persistent_docking_ref);
        }
      }
    }
  }
  return;
}

Assistant:

void ImGui::DockContextNewFrameUpdateUndocking(ImGuiContext* ctx)
{
    ImGuiContext& g = *ctx;
    ImGuiDockContext* dc  = &ctx->DockContext;
    if (!(g.IO.ConfigFlags & ImGuiConfigFlags_DockingEnable))
    {
        if (dc->Nodes.Data.Size > 0 || dc->Requests.Size > 0)
            DockContextClearNodes(ctx, 0, true);
        return;
    }

    // Setting NoSplit at runtime merges all nodes
    if (g.IO.ConfigDockingNoSplit)
        for (int n = 0; n < dc->Nodes.Data.Size; n++)
            if (ImGuiDockNode* node = (ImGuiDockNode*)dc->Nodes.Data[n].val_p)
                if (node->IsRootNode() && node->IsSplitNode())
                {
                    DockBuilderRemoveNodeChildNodes(node->ID);
                    //dc->WantFullRebuild = true;
                }

    // Process full rebuild
#if 0
    if (ImGui::IsKeyPressed(ImGui::GetKeyIndex(ImGuiKey_C)))
        dc->WantFullRebuild = true;
#endif
    if (dc->WantFullRebuild)
    {
        DockContextRebuildNodes(ctx);
        dc->WantFullRebuild = false;
    }

    // Process Undocking requests (we need to process them _before_ the UpdateMouseMovingWindowNewFrame call in NewFrame)
    for (int n = 0; n < dc->Requests.Size; n++)
    {
        ImGuiDockRequest* req = &dc->Requests[n];
        if (req->Type == ImGuiDockRequestType_Undock && req->UndockTargetWindow)
            DockContextProcessUndockWindow(ctx, req->UndockTargetWindow);
        else if (req->Type == ImGuiDockRequestType_Undock && req->UndockTargetNode)
            DockContextProcessUndockNode(ctx, req->UndockTargetNode);
    }
}